

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_left_delim_join.cpp
# Opt level: O1

SinkCombineResultType __thiscall
duckdb::PhysicalLeftDelimJoin::Combine
          (PhysicalLeftDelimJoin *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  LocalSinkState *pLVar1;
  PhysicalHashAggregate *pPVar2;
  OperatorSinkCombineInput distinct_combine_input;
  type local_40;
  type local_38;
  InterruptState *local_30;
  
  pLVar1 = input->local_state;
  LeftDelimJoinGlobalState::Merge
            ((LeftDelimJoinGlobalState *)input->global_state,
             (ColumnDataCollection *)&pLVar1[1].partition_info);
  local_40 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
             ::operator*(&(((this->super_PhysicalDelimJoin).distinct)->super_PhysicalOperator).
                          sink_state);
  local_38 = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
             operator*((unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                        *)(pLVar1 + 1));
  local_30 = input->interrupt_state;
  pPVar2 = (this->super_PhysicalDelimJoin).distinct;
  (*(pPVar2->super_PhysicalOperator)._vptr_PhysicalOperator[0x1b])(pPVar2,context,&local_40);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalLeftDelimJoin::Combine(ExecutionContext &context, OperatorSinkCombineInput &input) const {
	auto &lstate = input.local_state.Cast<LeftDelimJoinLocalState>();
	auto &gstate = input.global_state.Cast<LeftDelimJoinGlobalState>();
	gstate.Merge(lstate.lhs_data);

	OperatorSinkCombineInput distinct_combine_input {*distinct.sink_state, *lstate.distinct_state,
	                                                 input.interrupt_state};
	distinct.Combine(context, distinct_combine_input);

	return SinkCombineResultType::FINISHED;
}